

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTextureCubeGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  int i_1;
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_58 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  local_38 = ZEXT416((uint)fVar3);
  fVar2 = -fVar3;
  if (-fVar3 <= fVar3) {
    fVar2 = fVar3;
  }
  fVar3 = (float)(c->textures[0].texCube)->m_size / (fVar2 + fVar2);
  lVar1 = 0;
  fVar3 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar3,c->in[1].m_data[1] * fVar3,
                     c->in[2].m_data[0] * fVar3,fVar3 * c->in[2].m_data[1]);
  tcu::TextureCubeView::sample
            ((TextureCubeView *)&stack0xffffffffffffffd8,
             (Sampler *)&(c->textures[0].texCube)->m_view,s,t,(float)local_38._0_4_,fVar3);
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  do {
    local_58[lVar1] = *(float *)(&stack0xffffffffffffffd8 + lVar1 * 4) * (p->scale).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_48 + lVar1 * 4) = local_58[lVar1] + (p->bias).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = local_48;
  *(undefined8 *)((c->color).m_data + 2) = uStack_40;
  return;
}

Assistant:

static void		evalTextureCubeGrad		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = textureCube(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGradCube(c))*p.scale + p.bias; }